

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_command(Curl_easy *data)

{
  connectdata *pcVar1;
  IMAP *pIVar2;
  _Bool _Var3;
  char *local_30;
  char *command;
  POP3 *pop3;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pIVar2 = (data->req).p.imap;
  if ((*pIVar2->mailbox == '\0') || ((*(ulong *)&(data->set).field_0x89c >> 0xe & 1) != 0)) {
    local_30 = "LIST";
    if (*pIVar2->mailbox != '\0') {
      pIVar2->transfer = PPTRANSFER_INFO;
    }
  }
  else {
    local_30 = "RETR";
  }
  if ((pIVar2->uidvalidity != (char *)0x0) && (*pIVar2->uidvalidity != '\0')) {
    local_30 = pIVar2->uidvalidity;
  }
  if (*pIVar2->mailbox == '\0') {
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",local_30);
  }
  else {
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s %s",local_30,pIVar2->mailbox);
  }
  if (conn._4_4_ == CURLE_OK) {
    pop3_state(data,POP3_COMMAND);
    _Var3 = pop3_is_multiline(local_30);
    *(uint *)&(data->req).field_0xd1 =
         *(uint *)&(data->req).field_0xd1 & 0xfffdffff | (uint)((_Var3 ^ 0xffU) & 1) << 0x11;
  }
  return conn._4_4_;
}

Assistant:

static CURLcode pop3_perform_command(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct POP3 *pop3 = data->req.p.pop3;
  const char *command = NULL;

  /* Calculate the default command */
  if(pop3->id[0] == '\0' || data->set.list_only) {
    command = "LIST";

    if(pop3->id[0] != '\0')
      /* Message specific LIST so skip the BODY transfer */
      pop3->transfer = PPTRANSFER_INFO;
  }
  else
    command = "RETR";

  if(pop3->custom && pop3->custom[0] != '\0')
    command = pop3->custom;

  /* Send the command */
  if(pop3->id[0] != '\0')
    result = Curl_pp_sendf(data, &conn->proto.pop3c.pp, "%s %s",
                           command, pop3->id);
  else
    result = Curl_pp_sendf(data, &conn->proto.pop3c.pp, "%s", command);

  if(!result) {
    pop3_state(data, POP3_COMMAND);
    data->req.no_body = !pop3_is_multiline(command);
  }

  return result;
}